

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O2

void mnf::ExpMapMatrix::logarithm(RefVec *out,OutputType *R)

{
  double dVar1;
  double dVar2;
  Vector3d v;
  OutputType diff;
  undefined1 local_88 [16];
  double local_78;
  OutputType *local_70;
  OutputType *local_68;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_58 [8];
  double local_50;
  double local_30;
  double dStack_28;
  
  dVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  local_88._8_8_ =
       (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6];
  local_88._0_8_ =
       -(R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7];
  local_78 = -dVar1;
  dVar2 = acos(((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[4] +
                (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[8] +
                (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[0] + -1.0) * 0.5);
  if (1e-08 <= SQRT(dVar1 * dVar1 +
                    (double)local_88._8_8_ * (double)local_88._8_8_ +
                    (double)local_88._0_8_ * (double)local_88._0_8_)) {
    local_70 = R;
    local_68 = R;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (local_58,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                         *)&local_70);
    dVar1 = sin(dVar2);
    dVar2 = dVar2 / (dVar1 + dVar1);
    local_88._8_4_ = SUB84(dVar2 * dStack_28,0);
    local_88._0_8_ = dVar2 * local_30;
    local_88._12_4_ = (int)((ulong)(dVar2 * dStack_28) >> 0x20);
    local_78 = dVar2 * local_50;
  }
  Eigen::internal::
  call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Matrix<double,3,1,0,3,1>>
            (out,(Matrix<double,_3,_1,_0,_3,_1> *)local_88);
  return;
}

Assistant:

void ExpMapMatrix::logarithm(RefVec out, const OutputType& R)
{
  Eigen::Vector3d v(-R(1, 2), R(0, 2), -R(0, 1));
  double acosTr = std::acos((R.trace() - 1) / 2);
  if (v.norm() < prec)
    out = v;
  else
  {
    OutputType diff(R - R.transpose());
    double coeff = acosTr / (2 * std::sin(acosTr));
    v(0) = diff(2, 1) * coeff;
    v(1) = diff(0, 2) * coeff;
    v(2) = diff(1, 0) * coeff;
    out = v;
  }
}